

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O2

int __thiscall
NaPNFetcher::verify(NaPNFetcher *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                   size_t tbslen)

{
  uint uVar1;
  NaVector *pNVar2;
  long lVar3;
  int iVar4;
  undefined8 unaff_RBX;
  uint uVar5;
  char *fmt;
  
  if ((long)this->nOutDim < 0) {
    fmt = "VERIFY FAILED: output dimension is not set!\n";
  }
  else {
    iVar4 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    if (this->pfSumWeights != (NaReal *)0x0) {
      return iVar4;
    }
    uVar5 = 0;
    for (lVar3 = 0; this->nOutDim != lVar3; lVar3 = lVar3 + 1) {
      if (uVar5 <= this->piOutMap[lVar3]) {
        uVar5 = this->piOutMap[lVar3];
      }
    }
    pNVar2 = NaPetriCnInput::data(&this->in);
    uVar1 = (*pNVar2->_vptr_NaVector[6])(pNVar2);
    if (uVar5 < uVar1) {
      return iVar4;
    }
    fmt = "VERIFY FAILED: some output positions are out of input range!\n";
  }
  NaPrintLog(fmt);
  return 0;
}

Assistant:

bool
NaPNFetcher::verify ()
{
  if(nOutDim < 0){
    NaPrintLog("VERIFY FAILED: output dimension is not set!\n");
    return false;
  }

  if(NULL == pfSumWeights)
    {
      int	i;
      unsigned	iMaxPos = 0;
      for(i = 0; i < nOutDim; ++i){
	if(iMaxPos < piOutMap[i])
	  iMaxPos = piOutMap[i];
      }

      if((unsigned)iMaxPos >= in.data().dim()){
	NaPrintLog("VERIFY FAILED: some output positions are out "\
		   "of input range!\n");
	return false;
      }
    }

  return true;
}